

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

err_t SetBlockGroupParent(ebml_master *Element,void *Parent,void *Before)

{
  ebml_context *Context;
  matroska_block *Block_00;
  bool_t bVar1;
  mkv_timestamp_t Timestamp;
  mkv_timestamp_t ClusterTimestamp;
  void *pvVar2;
  mkv_timestamp_t AbsTimestamp;
  matroska_block *Block;
  err_t Result;
  void *Before_local;
  void *Parent_local;
  ebml_master *Element_local;
  
  Block = (matroska_block *)0x0;
  Context = MATROSKA_getContextBlock();
  Block_00 = (matroska_block *)EBML_MasterFindFirstElt(Element,Context,0,0,0);
  if ((((Block_00 != (matroska_block *)0x0) && (Block_00->LocalTimestampUsed != 0)) &&
      (Parent != (void *)0x0)) &&
     (((Block_00->Base).Base.Base.Parent != (nodetree *)0x0 &&
      (((Block_00->Base).Base.Base.Parent)->Parent != (nodetree *)0x0)))) {
    bVar1 = Node_IsPartOf(Parent,0x55434b4d);
    if (bVar1 == 0) {
      __assert_fail("Node_IsPartOf(Parent,MATROSKA_CLUSTER_CLASS)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x54d,"err_t SetBlockGroupParent(ebml_master *, void *, void *)");
    }
    Timestamp = MATROSKA_BlockTimestamp(Block_00);
    if (Timestamp == 0x7fffffffffffffff) {
      __assert_fail("AbsTimestamp != INVALID_TIMESTAMP_T",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x54f,"err_t SetBlockGroupParent(ebml_master *, void *, void *)");
    }
    ClusterTimestamp = MATROSKA_ClusterTimestamp((matroska_cluster *)Parent);
    Block = (matroska_block *)MATROSKA_BlockSetTimestamp(Block_00,Timestamp,ClusterTimestamp);
  }
  if (Block == (matroska_block *)0x0) {
    pvVar2 = Node_InheritedVMT((node *)Element,0x47424b4d);
    Block = (matroska_block *)(**(code **)((long)pvVar2 + 0x48))(Element,Parent,Before);
  }
  return (err_t)Block;
}

Assistant:

static err_t SetBlockGroupParent(ebml_master *Element, void* Parent, void* Before)
{
    // update the timestamp
    err_t Result = ERR_NONE;
    matroska_block *Block = (matroska_block*)EBML_MasterFindChild(Element, MATROSKA_getContextBlock());
    mkv_timestamp_t AbsTimestamp;
    if (Block && Block->LocalTimestampUsed && Parent && NodeTree_Parent(Block) && NodeTree_Parent(NodeTree_Parent(Block)))
    {
        assert(Node_IsPartOf(Parent,MATROSKA_CLUSTER_CLASS));
        AbsTimestamp = MATROSKA_BlockTimestamp(Block);
        assert(AbsTimestamp != INVALID_TIMESTAMP_T);
        Result = MATROSKA_BlockSetTimestamp(Block,AbsTimestamp,MATROSKA_ClusterTimestamp((matroska_cluster*)Parent));
    }
    if (Result==ERR_NONE)
        Result = INHERITED(Element,nodetree_vmt,MATROSKA_BLOCKGROUP_CLASS)->SetParent(Element, Parent, Before);
    return Result;
}